

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

void __thiscall llvm::APInt::XorAssignSlowCase(APInt *this,APInt *RHS)

{
  uint uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  
  uVar1 = this->BitWidth;
  if ((ulong)uVar1 != 0) {
    puVar2 = (this->U).pVal;
    puVar3 = (RHS->U).pVal;
    uVar4 = 0;
    do {
      puVar2[uVar4] = puVar2[uVar4] ^ puVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while ((ulong)uVar1 + 0x3f >> 6 != uVar4);
  }
  return;
}

Assistant:

unsigned getNumWords() const { return getNumWords(BitWidth); }